

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detect.cpp
# Opt level: O2

void writeReads(BamReader *br,RefVector *ref,int refID,string *refName,int st,int en,int bpRegion,
               string *folderPath)

{
  bool bVar1;
  int refID_local;
  RefVector *local_490;
  vector<int,_std::allocator<int>_> clipSizes;
  vector<SoftNode,_std::allocator<SoftNode>_> insNodesDown;
  vector<SoftNode,_std::allocator<SoftNode>_> insNodesUp;
  vector<int,_std::allocator<int>_> genomePositions;
  vector<int,_std::allocator<int>_> readPositions;
  vector<SoftCluster,_std::allocator<SoftCluster>_> insClustersDown;
  vector<SoftCluster,_std::allocator<SoftCluster>_> insClustersUp;
  string outFile;
  BamAlignment aln;
  ofstream ofs;
  
  refID_local = refID;
  local_490 = ref;
  std::ofstream::ofstream(&ofs);
  std::operator+(&outFile,folderPath,"tmp/ins/reads.fastq");
  std::ofstream::open((string *)&ofs,(_Ios_Openmode)&outFile);
  insNodesUp.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  insNodesDown.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  insNodesUp.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  insNodesUp.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  insClustersUp.super__Vector_base<SoftCluster,_std::allocator<SoftCluster>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  insNodesDown.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  insNodesDown.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  insClustersDown.super__Vector_base<SoftCluster,_std::allocator<SoftCluster>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  insClustersUp.super__Vector_base<SoftCluster,_std::allocator<SoftCluster>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  insClustersUp.super__Vector_base<SoftCluster,_std::allocator<SoftCluster>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  insClustersDown.super__Vector_base<SoftCluster,_std::allocator<SoftCluster>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  insClustersDown.super__Vector_base<SoftCluster,_std::allocator<SoftCluster>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  aln.Name._M_dataplus._M_p._0_4_ = st - bpRegion;
  clipSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(clipSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,en + bpRegion);
  BamTools::BamReader::SetRegion(br,&refID_local,(int *)&aln,&refID_local,(int *)&clipSizes);
  BamTools::BamAlignment::BamAlignment(&aln);
  while( true ) {
    bVar1 = BamTools::BamReader::GetNextAlignment(br,&aln);
    if (!bVar1) break;
    bVar1 = BamTools::BamAlignment::IsMapped(&aln);
    if (bVar1) {
      if (0x13 < aln.MapQuality) {
        clipSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        clipSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        clipSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        readPositions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        readPositions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        readPositions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        genomePositions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        genomePositions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        genomePositions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar1 = BamTools::BamAlignment::GetSoftClips
                          (&aln,(vector<int,_std::allocator<int>_> *)
                                &clipSizes.super__Vector_base<int,_std::allocator<int>_>,
                           (vector<int,_std::allocator<int>_> *)
                           &readPositions.super__Vector_base<int,_std::allocator<int>_>,
                           (vector<int,_std::allocator<int>_> *)
                           &genomePositions.super__Vector_base<int,_std::allocator<int>_>,false);
        if (bVar1) {
          outputFastq(&aln,&ofs);
          addSC(&aln,local_490,&insNodesUp,&insNodesDown);
        }
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&genomePositions.super__Vector_base<int,_std::allocator<int>_>);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&readPositions.super__Vector_base<int,_std::allocator<int>_>);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&clipSizes.super__Vector_base<int,_std::allocator<int>_>);
      }
    }
    else {
      outputFastq(&aln,&ofs);
    }
  }
  std::ofstream::close();
  BamTools::BamAlignment::~BamAlignment(&aln);
  std::vector<SoftCluster,_std::allocator<SoftCluster>_>::~vector(&insClustersDown);
  std::vector<SoftCluster,_std::allocator<SoftCluster>_>::~vector(&insClustersUp);
  std::vector<SoftNode,_std::allocator<SoftNode>_>::~vector(&insNodesDown);
  std::vector<SoftNode,_std::allocator<SoftNode>_>::~vector(&insNodesUp);
  std::__cxx11::string::~string((string *)&outFile);
  std::ofstream::~ofstream(&ofs);
  return;
}

Assistant:

void writeReads(BamTools::BamReader &br, const BamTools::RefVector &ref, int refID, const std::string &refName, int st, int en, int bpRegion, const std::string &folderPath)
{
	std::ofstream ofs;
	std::string outFile = folderPath + "tmp/ins/reads.fastq";
	ofs.open(outFile, std::ofstream::out | std::ofstream::app);

	std::vector<SoftNode> insNodesUp, insNodesDown;
	std::vector<SoftCluster> insClustersUp, insClustersDown;

	br.SetRegion(refID, st - bpRegion, refID, en + bpRegion);
	BamTools::BamAlignment aln;
	while (br.GetNextAlignment(aln))
	{
		// OEA unmapped reads have mapping qual 0
		// current aln is unmapped, but it's mate lies in region, hence we can even parse cur aln
		if (!aln.IsMapped())
		{
			outputFastq(aln, ofs);
			continue;
		}

		if (aln.MapQuality < MIN_MAP_QUAL)
			continue;

		std::vector<int> clipSizes, readPositions, genomePositions;
		bool isSC = aln.GetSoftClips(clipSizes, readPositions, genomePositions);
		if (isSC)
		{
			outputFastq(aln, ofs);
			addSC(aln, ref, insNodesUp, insNodesDown);
		}
	}
	ofs.close();
}